

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

void __thiscall
optTyped_valueConstructorConstRvalue_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>::TestBody
          (optTyped_valueConstructorConstRvalue_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>
           *this)

{
  value_type_conflict *lhs;
  bool *pbVar1;
  char *pcVar2;
  storage_type local_40 [8];
  AssertHelper local_38;
  AssertionResult gtest_ar_;
  
  lhs = &(this->super_optTyped<mp::opt<bool,_mp::opt_default_policy<bool>_>_>).value_1;
  gtest_ar_.success_ = true;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = true;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  local_40[0] = (storage_type)
                (this->super_optTyped<mp::opt<bool,_mp::opt_default_policy<bool>_>_>).value_1;
  pbVar1 = mp::opt<bool,_mp::opt_default_policy<bool>_>::operator*
                     ((opt<bool,_mp::opt_default_policy<bool>_> *)local_40);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&gtest_ar_,"this->value_1","*make()",lhs,pbVar1);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)local_40);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x182,pcVar2);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_40);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  local_40[0].value = *lhs;
  pbVar1 = mp::opt<bool,_mp::opt_default_policy<bool>_>::value
                     ((opt<bool,_mp::opt_default_policy<bool>_> *)local_40);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&gtest_ar_,"this->value_1","make().value()",lhs,pbVar1);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)local_40);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x183,pcVar2);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_40);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  local_38.data_._0_1_ =
       (opt<bool,mp::opt_default_policy<bool>>)
       (this->super_optTyped<mp::opt<bool,_mp::opt_default_policy<bool>_>_>).value_1;
  local_40[0].value =
       mp::opt<bool,mp::opt_default_policy<bool>>::value_or<bool_const&>
                 ((opt<bool,mp::opt_default_policy<bool>> *)&local_38,
                  &(this->super_optTyped<mp::opt<bool,_mp::opt_default_policy<bool>_>_>).value_2);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&gtest_ar_,"this->value_1","make().value_or(this->value_2)",lhs,
             &local_40[0].value);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)local_40);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x184,pcVar2);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_40);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  return;
}

Assistant:

TYPED_TEST(optTyped, valueConstructorConstRvalue)
{
  using opt_type = typename TestFixture::type;
  auto make = [&]() -> const opt_type { return opt_type{this->value_1}; };
  EXPECT_TRUE(make());
  EXPECT_TRUE(make().has_value());
  EXPECT_EQ(this->value_1, *make());
  EXPECT_EQ(this->value_1, make().value());
  EXPECT_EQ(this->value_1, make().value_or(this->value_2));
}